

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int reparse_path_expr(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  uint uVar10;
  int local_38;
  int local_34;
  
  if (exp->used == *exp_idx) {
    ly_vlog(ctx,LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
    return -1;
  }
  uVar5 = *exp_idx;
  switch(exp->tokens[uVar5]) {
  case LYXP_TOKEN_PAR1:
    *exp_idx = uVar5 + 1;
    iVar6 = reparse_or_expr(ctx,exp,exp_idx);
    if (iVar6 != 0) {
      return -1;
    }
    iVar6 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_PAR2,1);
    if (iVar6 != 0) {
      return -1;
    }
    uVar5 = *exp_idx;
  case LYXP_TOKEN_LITERAL:
  case LYXP_TOKEN_NUMBER:
    *exp_idx = uVar5 + 1;
LAB_0017938b:
    while( true ) {
      uVar5 = *exp_idx;
      if (exp->used <= uVar5) {
        return 0;
      }
      if (exp->tokens[uVar5] != LYXP_TOKEN_BRACK1) break;
      iVar6 = reparse_predicate(ctx,exp,exp_idx);
      if (iVar6 != 0) {
        return -1;
      }
    }
    if (exp->used <= uVar5) {
      return 0;
    }
    if (exp->tokens[uVar5] != LYXP_TOKEN_OPERATOR_PATH) {
      return 0;
    }
    *exp_idx = uVar5 + 1;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
    iVar6 = reparse_relative_location_path(ctx,exp,exp_idx);
    goto LAB_0017932c;
  default:
    pcVar7 = print_token(exp->tokens[uVar5]);
    ly_vlog(ctx,LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar7,exp->expr + exp->expr_pos[*exp_idx])
    ;
    return -1;
  case LYXP_TOKEN_FUNCNAME:
    iVar6 = exp_check_token(ctx,exp,uVar5,LYXP_TOKEN_FUNCNAME,1);
    if (iVar6 != 0) {
      return -1;
    }
    break;
  case LYXP_TOKEN_OPERATOR_PATH:
    iVar6 = exp_check_token(ctx,exp,uVar5,LYXP_TOKEN_OPERATOR_PATH,1);
    if (iVar6 != 0) {
      return -1;
    }
    uVar5 = *exp_idx + 1;
    uVar1 = exp->tok_len[*exp_idx];
    *exp_idx = uVar5;
    if (uVar1 == 1) {
      if (exp->used == uVar5) {
        return 0;
      }
      if (LYXP_TOKEN_NODETYPE < exp->tokens[uVar5]) {
        return 0;
      }
      if ((0x6e0U >> (exp->tokens[uVar5] & (LYXP_TOKEN_OPERATOR_PATH|LYXP_TOKEN_OPERATOR_UNI)) & 1)
          == 0) {
        return 0;
      }
    }
    iVar6 = reparse_relative_location_path(ctx,exp,exp_idx);
LAB_0017932c:
    if (iVar6 == 0) {
      return 0;
    }
    return -1;
  }
  uVar5 = *exp_idx;
  uVar2 = exp->tok_len[uVar5];
  local_34 = -1;
  bVar4 = true;
  switch(uVar2) {
  case 3:
    pcVar7 = exp->expr + exp->expr_pos[uVar5];
    iVar6 = strncmp(pcVar7,"not",3);
    if (iVar6 != 0) {
      pcVar9 = "xpath_sum";
      sVar8 = 3;
LAB_00179508:
      local_38 = 1;
      iVar6 = strncmp(pcVar7,pcVar9 + 6,sVar8);
      if (iVar6 == 0) {
        bVar4 = false;
        local_34 = 1;
      }
      goto LAB_00179a2a;
    }
    goto LAB_001798a1;
  case 4:
    pcVar7 = exp->expr + exp->expr_pos[uVar5];
    iVar6 = strncmp(pcVar7,"lang",4);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar7,"last",4);
      if (iVar6 == 0) goto LAB_001799f6;
      iVar6 = strncmp(pcVar7,"name",4);
      if (iVar6 != 0) {
        pcVar9 = "true";
        sVar8 = 4;
        goto LAB_00179877;
      }
      goto LAB_001799d7;
    }
    goto LAB_001798a1;
  case 5:
    pcVar7 = exp->expr + exp->expr_pos[uVar5];
    iVar6 = strncmp(pcVar7,"count",5);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar7,"false",5);
      if (iVar6 == 0) goto LAB_001799f6;
      iVar6 = strncmp(pcVar7,"floor",5);
      if ((iVar6 != 0) && (iVar6 = strncmp(pcVar7,"round",5), iVar6 != 0)) {
        pcVar9 = "xpath_deref";
        sVar8 = 5;
        goto LAB_00179508;
      }
    }
    goto LAB_001798a1;
  case 6:
    pcVar7 = exp->expr + exp->expr_pos[uVar5];
    iVar6 = strncmp(pcVar7,"concat",6);
    if (iVar6 == 0) goto LAB_001799e3;
    iVar6 = strncmp(pcVar7,"number",6);
    if (iVar6 != 0) {
      pcVar9 = "string";
      sVar8 = 6;
      goto LAB_00179747;
    }
    goto LAB_001799d7;
  case 7:
    pcVar7 = exp->expr + exp->expr_pos[uVar5];
    iVar6 = strncmp(pcVar7,"boolean",7);
    if ((iVar6 != 0) && (iVar6 = strncmp(pcVar7,"ceiling",7), iVar6 != 0)) {
      pcVar9 = "current";
      sVar8 = 7;
LAB_00179877:
      local_38 = 1;
      iVar6 = strncmp(pcVar7,pcVar9,sVar8);
      if (iVar6 == 0) {
        bVar4 = false;
        local_34 = 0;
        local_38 = 0;
      }
      goto LAB_00179a2a;
    }
LAB_001798a1:
    local_38 = 1;
    local_34 = 1;
    break;
  case 8:
    pcVar7 = exp->expr + exp->expr_pos[uVar5];
    iVar6 = strncmp(pcVar7,"contains",8);
    local_38 = 2;
    if (iVar6 == 0) {
      local_34 = 2;
    }
    else {
      iVar6 = strncmp(pcVar7,"position",8);
      if (iVar6 != 0) {
        iVar6 = strncmp(pcVar7,"re-match",8);
        if (iVar6 == 0) {
          bVar4 = false;
          local_34 = 2;
        }
        goto LAB_00179a2a;
      }
LAB_001799f6:
      local_34 = 0;
      local_38 = 0;
    }
    break;
  case 9:
    uVar3 = exp->expr_pos[uVar5];
    pcVar7 = exp->expr;
    iVar6 = strncmp(pcVar7 + uVar3,"substring",9);
    if (iVar6 != 0) {
      iVar6 = strncmp(pcVar7 + uVar3,"translate",9);
      if (iVar6 == 0) {
        local_34 = 3;
        bVar4 = false;
        local_38 = 3;
      }
      goto LAB_00179a2a;
    }
LAB_001799e3:
    local_38 = 3;
    local_34 = 2;
    break;
  case 10:
    pcVar7 = exp->expr + exp->expr_pos[uVar5];
    iVar6 = strncmp(pcVar7,"local-name",10);
    if (iVar6 == 0) goto LAB_001799d7;
    iVar6 = strncmp(pcVar7,"enum-value",10);
    if (iVar6 != 0) {
      pcVar9 = "bit-is-set";
      sVar8 = 10;
      goto LAB_00179968;
    }
    local_34 = 1;
    local_38 = 1;
    break;
  case 0xb:
    pcVar9 = exp->expr + exp->expr_pos[uVar5];
    pcVar7 = "starts-with";
    sVar8 = 0xb;
    goto LAB_001799b2;
  case 0xc:
    pcVar9 = exp->expr + exp->expr_pos[uVar5];
    pcVar7 = "derived-from";
    sVar8 = 0xc;
    goto LAB_001799b2;
  case 0xd:
    pcVar7 = exp->expr + exp->expr_pos[uVar5];
    iVar6 = strncmp(pcVar7,"namespace-uri",0xd);
    if (iVar6 != 0) {
      pcVar9 = "string-length";
      sVar8 = 0xd;
LAB_00179747:
      local_38 = 1;
      iVar6 = strncmp(pcVar7,pcVar9,sVar8);
      if (iVar6 == 0) {
        bVar4 = false;
        local_34 = 0;
      }
      goto LAB_00179a2a;
    }
LAB_001799d7:
    local_38 = 1;
    local_34 = 0;
    break;
  default:
    goto LAB_00179a2a;
  case 0xf:
    pcVar7 = exp->expr + exp->expr_pos[uVar5];
    iVar6 = strncmp(pcVar7,"normalize-space",0xf);
    if (iVar6 == 0) goto LAB_001799d7;
    pcVar9 = "substring-after";
    sVar8 = 0xf;
LAB_00179968:
    iVar6 = strncmp(pcVar7,pcVar9,sVar8);
    if (iVar6 != 0) goto LAB_00179a2a;
    goto LAB_001799bb;
  case 0x10:
    pcVar9 = exp->expr + exp->expr_pos[uVar5];
    pcVar7 = "substring-before";
    sVar8 = 0x10;
    goto LAB_001799b2;
  case 0x14:
    pcVar9 = exp->expr + exp->expr_pos[uVar5];
    pcVar7 = "derived-from-or-self";
    sVar8 = 0x14;
LAB_001799b2:
    iVar6 = strncmp(pcVar9,pcVar7,sVar8);
    if (iVar6 == 0) {
LAB_001799bb:
      local_34 = 2;
      bVar4 = false;
      local_38 = 2;
    }
    goto LAB_00179a2a;
  }
  bVar4 = false;
LAB_00179a2a:
  if (bVar4) {
    ly_vlog(ctx,LYE_XPATH_INFUNC,LY_VLOG_NONE,(void *)0x0,(ulong)uVar2,
            exp->expr + exp->expr_pos[uVar5]);
  }
  else {
    *exp_idx = uVar5 + 1;
    iVar6 = exp_check_token(ctx,exp,uVar5 + 1,LYXP_TOKEN_PAR1,1);
    if (iVar6 == 0) {
      uVar1 = *exp_idx;
      *exp_idx = uVar1 + 1;
      if (exp->used == (uint16_t)(uVar1 + 1)) {
        ly_vlog(ctx,LYE_XPATH_EOF,LY_VLOG_NONE,(void *)0x0);
      }
      else {
        uVar10 = 0;
        if (exp->tokens[*exp_idx] != LYXP_TOKEN_PAR2) {
          iVar6 = reparse_or_expr(ctx,exp,exp_idx);
          if (iVar6 != 0) {
            return -1;
          }
          uVar10 = 1;
        }
        do {
          uVar2 = *exp_idx;
          if ((exp->used <= uVar2) || (exp->tokens[uVar2] != LYXP_TOKEN_COMMA)) {
            iVar6 = exp_check_token(ctx,exp,uVar2,LYXP_TOKEN_PAR2,1);
            if (iVar6 != 0) {
              return -1;
            }
            *exp_idx = *exp_idx + 1;
            if ((int)uVar10 < local_34 || local_38 < (int)uVar10) {
              ly_vlog(ctx,LYE_XPATH_INARGCOUNT,LY_VLOG_NONE,(void *)0x0,(ulong)uVar10,
                      (ulong)*(ushort *)((long)exp->tok_len + (ulong)((uint)uVar5 * 2)),
                      exp->expr + *(ushort *)((long)exp->expr_pos + (ulong)((uint)uVar5 * 2)));
              return -1;
            }
            goto LAB_0017938b;
          }
          *exp_idx = uVar2 + 1;
          uVar10 = uVar10 + 1;
          iVar6 = reparse_or_expr(ctx,exp,exp_idx);
        } while (iVar6 == 0);
      }
    }
  }
  return -1;
}

Assistant:

static int
reparse_path_expr(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_NONE, 1)) {
        return -1;
    }

    switch (exp->tokens[*exp_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' Predicate* */
        ++(*exp_idx);

        if (reparse_or_expr(ctx, exp, exp_idx)) {
            return -1;
        }

        if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_PAR2, 1)) {
            return -1;
        }
        ++(*exp_idx);
        goto predicate;
        break;
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        if (reparse_relative_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
        break;
    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        if (reparse_function_call(ctx, exp, exp_idx)) {
            return -1;
        }
        goto predicate;
        break;
    case LYXP_TOKEN_OPERATOR_PATH:
        /* AbsoluteLocationPath */
        if (reparse_absolute_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
        break;
    case LYXP_TOKEN_LITERAL:
        /* Literal */
        ++(*exp_idx);
        goto predicate;
        break;
    case LYXP_TOKEN_NUMBER:
        /* Number */
        ++(*exp_idx);
        goto predicate;
        break;
    default:
        LOGVAL(ctx, LYE_XPATH_INTOK, LY_VLOG_NONE, NULL,
               print_token(exp->tokens[*exp_idx]), &exp->expr[exp->expr_pos[*exp_idx]]);
        return -1;
    }

    return EXIT_SUCCESS;

predicate:
    /* Predicate* */
    while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_BRACK1)) {
        if (reparse_predicate(ctx, exp, exp_idx)) {
            return -1;
        }
    }

    /* ('/' or '//') RelativeLocationPath */
    if ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_OPERATOR_PATH)) {

        /* '/' or '//' */
        ++(*exp_idx);

        if (reparse_relative_location_path(ctx, exp, exp_idx)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}